

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_Brep::InternalBrepBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_Brep *this,bool bLazy,bool bUpdateCachedBBox)

{
  uint uVar1;
  ON_BrepFace *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ON_BoundingBox brep_bbox;
  ON_BoundingBox face_bbox;
  ON_BoundingBox *local_a8;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  if ((int)CONCAT71(in_register_00000011,bLazy) != 0) {
    bVar8 = ON_BoundingBox::IsNotEmpty(&this->m_bbox);
    if (bVar8) {
      dVar3 = (this->m_bbox).m_min.x;
      dVar4 = (this->m_bbox).m_min.y;
      dVar5 = (this->m_bbox).m_min.z;
      dVar6 = (this->m_bbox).m_max.x;
      dVar7 = (this->m_bbox).m_max.z;
      (__return_storage_ptr__->m_max).y = (this->m_bbox).m_max.y;
      (__return_storage_ptr__->m_max).z = dVar7;
      (__return_storage_ptr__->m_min).z = dVar5;
      (__return_storage_ptr__->m_max).x = dVar6;
      (__return_storage_ptr__->m_min).x = dVar3;
      (__return_storage_ptr__->m_min).y = dVar4;
      return __return_storage_ptr__;
    }
  }
  local_a8 = &local_90;
  ON_BoundingBox::ON_BoundingBox(local_a8);
  uVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  uVar11 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar11;
  }
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pOVar2 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    if ((*(int *)((pOVar2->m_face_uuid).Data4 + (uVar11 - 0x30)) != -1) &&
       ((long)uVar10 <
        (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count
       )) {
      ON_BrepFace::InternalFaceBoundingBox
                (&local_60,(ON_BrepFace *)((pOVar2->m_face_uuid).Data4 + (uVar11 - 0x5c)),bLazy,
                 bUpdateCachedBBox);
      bVar8 = ON_BoundingBox::IsNotEmpty(&local_60);
      if (bVar8) {
        ON_BoundingBox::Union(&local_90,&local_60);
      }
    }
    uVar11 = uVar11 + 0xd8;
  }
  bVar8 = ON_BoundingBox::IsNotEmpty(&local_90);
  if (!bVar8) {
    local_a8 = &ON_BoundingBox::EmptyBoundingBox;
  }
  if (bUpdateCachedBBox && bVar8) {
    local_a8 = &local_90;
    (this->m_bbox).m_max.y = local_90.m_max.y;
    (this->m_bbox).m_max.z = local_90.m_max.z;
    (this->m_bbox).m_min.z = local_90.m_min.z;
    (this->m_bbox).m_max.x = local_90.m_max.x;
    (this->m_bbox).m_min.x = local_90.m_min.x;
    (this->m_bbox).m_min.y = local_90.m_min.y;
  }
  dVar3 = (local_a8->m_min).x;
  dVar4 = (local_a8->m_min).y;
  dVar5 = (local_a8->m_min).z;
  dVar6 = (local_a8->m_max).x;
  dVar7 = (local_a8->m_max).z;
  (__return_storage_ptr__->m_max).y = (local_a8->m_max).y;
  (__return_storage_ptr__->m_max).z = dVar7;
  (__return_storage_ptr__->m_min).z = dVar5;
  (__return_storage_ptr__->m_max).x = dVar6;
  (__return_storage_ptr__->m_min).x = dVar3;
  (__return_storage_ptr__->m_min).y = dVar4;
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_Brep::InternalBrepBoundingBox(bool bLazy, bool bUpdateCachedBBox) const
{
  if (bLazy && m_bbox.IsNotEmpty())
    return m_bbox;

  ON_BoundingBox brep_bbox;
  const int face_count = m_F.Count();
  int fi;
  for (fi = 0; fi < face_count; fi++)
  {
    if (m_F[fi].m_face_index == -1)
      continue;

    //GBA 20 May 2020. RH-58462. Brep box now computed from face boxes, instead of surface boxes.
    const ON_BrepFace* f = Face(fi);
    if (nullptr == f)
      continue;

    const ON_BoundingBox face_bbox = f->InternalFaceBoundingBox(bLazy, bUpdateCachedBBox);
    if (false == face_bbox.IsNotEmpty())
      continue;

    brep_bbox.Union(face_bbox);
  }

  if (false == brep_bbox.IsNotEmpty())
  {
    // ON_Brep code has always used ON_BoundingBox::EmptyBoundingBox 
    // to indicate a bounding box is not set. If it were to be written
    // in modern times, it would have used Nans.
    return ON_BoundingBox::EmptyBoundingBox;
  }

  if (bUpdateCachedBBox)
    const_cast<ON_Brep*>(this)->m_bbox = brep_bbox;
  return brep_bbox;
}